

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageAlphaPremultiply(Image *image)

{
  byte bVar1;
  int newFormat;
  uint uVar2;
  Color *pCVar3;
  ulong uVar4;
  float fVar5;
  Image in_stack_00000000;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar3 = LoadImageColors(in_stack_00000000);
    uVar2 = image->height * image->width;
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        bVar1 = pCVar3[uVar4].a;
        if (bVar1 != 0xff) {
          if (bVar1 == 0) {
            pCVar3[uVar4].r = '\0';
            pCVar3[uVar4].g = '\0';
            pCVar3[uVar4].b = '\0';
          }
          else {
            fVar5 = (float)bVar1 / 255.0;
            pCVar3[uVar4].r = (uchar)(int)((float)pCVar3[uVar4].r * fVar5);
            pCVar3[uVar4].g = (uchar)(int)((float)pCVar3[uVar4].g * fVar5);
            pCVar3[uVar4].b = (uchar)(int)((float)pCVar3[uVar4].b * fVar5);
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    free(image->data);
    newFormat = image->format;
    image->data = pCVar3;
    image->format = 7;
    ImageFormat(image,newFormat);
    return;
  }
  return;
}

Assistant:

void ImageAlphaPremultiply(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    float alpha = 0.0f;
    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        if (pixels[i].a == 0)
        {
            pixels[i].r = 0;
            pixels[i].g = 0;
            pixels[i].b = 0;
        }
        else if (pixels[i].a < 255)
        {
            alpha = (float)pixels[i].a/255.0f;
            pixels[i].r = (unsigned char)((float)pixels[i].r*alpha);
            pixels[i].g = (unsigned char)((float)pixels[i].g*alpha);
            pixels[i].b = (unsigned char)((float)pixels[i].b*alpha);
        }
    }

    RL_FREE(image->data);

    int format = image->format;
    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}